

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O1

void Vec_StrPrintNumStar(Vec_Str_t *p,int Num,int nDigits)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  size_t sVar9;
  char Digits [16];
  char local_38 [16];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  if (Num == 0) {
    if (nDigits < 1) {
      return;
    }
    do {
      uVar2 = p->nCap;
      if (p->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar5;
          sVar9 = 0x10;
        }
        else {
          sVar9 = (ulong)uVar2 * 2;
          if ((int)sVar9 <= (int)uVar2) goto LAB_002205b5;
          if (p->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar9);
          }
          else {
            pcVar5 = (char *)realloc(p->pArray,sVar9);
          }
          p->pArray = pcVar5;
        }
        p->nCap = (int)sVar9;
      }
LAB_002205b5:
      iVar4 = p->nSize;
      p->nSize = iVar4 + 1;
      p->pArray[iVar4] = '0';
      nDigits = nDigits + -1;
      if (nDigits == 0) {
        return;
      }
    } while( true );
  }
  if (-1 < Num) goto LAB_0022062a;
  uVar2 = p->nCap;
  if (p->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(p->pArray,0x10);
      }
      p->pArray = pcVar5;
      sVar9 = 0x10;
    }
    else {
      sVar9 = (ulong)uVar2 * 2;
      if ((int)sVar9 <= (int)uVar2) goto LAB_00220613;
      if (p->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar9);
      }
      else {
        pcVar5 = (char *)realloc(p->pArray,sVar9);
      }
      p->pArray = pcVar5;
    }
    p->nCap = (int)sVar9;
  }
LAB_00220613:
  iVar4 = p->nSize;
  p->nSize = iVar4 + 1;
  p->pArray[iVar4] = '-';
  Num = -Num;
  nDigits = nDigits + -1;
LAB_0022062a:
  lVar6 = 0;
  do {
    local_38[lVar6] = (char)Num + (char)((uint)Num / 10) * -10;
    lVar6 = lVar6 + 1;
    bVar3 = 9 < (uint)Num;
    Num = (uint)Num / 10;
  } while (bVar3);
  iVar4 = (int)lVar6;
  if ((int)lVar6 < nDigits) {
    iVar4 = nDigits;
  }
  iVar8 = iVar4 + 1;
  pcVar5 = local_38 + (iVar4 - 1);
  do {
    cVar1 = *pcVar5;
    uVar2 = p->nCap;
    if (p->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(0x10);
        }
        else {
          pcVar7 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar7;
        sVar9 = 0x10;
      }
      else {
        sVar9 = (ulong)uVar2 * 2;
        if ((int)sVar9 <= (int)uVar2) goto LAB_002206cf;
        if (p->pArray == (char *)0x0) {
          pcVar7 = (char *)malloc(sVar9);
        }
        else {
          pcVar7 = (char *)realloc(p->pArray,sVar9);
        }
        p->pArray = pcVar7;
      }
      p->nCap = (int)sVar9;
    }
LAB_002206cf:
    iVar4 = p->nSize;
    p->nSize = iVar4 + 1;
    p->pArray[iVar4] = cVar1 + '0';
    iVar8 = iVar8 + -1;
    pcVar5 = pcVar5 + -1;
    if (iVar8 < 2) {
      return;
    }
  } while( true );
}

Assistant:

static inline void Vec_StrPrintNumStar( Vec_Str_t * p, int Num, int nDigits )
{
    int i;
    char Digits[16] = {0};
    if ( Num == 0 )
    {
        for ( i = 0; i < nDigits; i++ )
            Vec_StrPush( p, '0' );
        return;
    }
    if ( Num < 0 )
    {
        Vec_StrPush( p, '-' );
        Num = -Num;
        nDigits--;
    }
    for ( i = 0; Num; Num /= 10,  i++ )
        Digits[i] = Num % 10;
    for ( i = Abc_MaxInt(i, nDigits)-1; i >= 0; i-- )
        Vec_StrPush( p, (char)('0' + Digits[i]) );
}